

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void ll_foreach(ll_node *node,ll_closure fn)

{
  ll_node *cur_node;
  
  if (node != (ll_node *)0x0 && fn != (ll_closure)0x0) {
    do {
      (*fn)((void **)node->value_ptr);
      node = node->next;
    } while (node != (ll_node *)0x0);
  }
  return;
}

Assistant:

void ll_foreach(const struct ll_node *node, ll_closure fn)
{
	struct ll_node *cur_node = (struct ll_node *)node;
	if (fn == NULL) {
		return;
	}
	while (cur_node != NULL) {
		fn(cur_node->value_ptr);
		cur_node = cur_node->next;
	}
}